

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_enable_msi(int device_fd)

{
  __off_t __offset;
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  code *pcVar9;
  ssize_t sVar10;
  size_t sVar11;
  char *pcVar12;
  void *pvVar13;
  int __timeout;
  epoll_event *__events;
  undefined4 uVar14;
  ulong uVar15;
  char *__buf;
  undefined1 *puVar16;
  undefined1 *puVar17;
  epoll_event *peVar18;
  ulong unaff_R12;
  long lVar19;
  ulong *puVar20;
  code *unaff_R15;
  char irq_set_buf [24];
  char buf [512];
  undefined8 auStack_3540 [2];
  size_t asStack_3530 [67];
  long lStack_3318;
  int iStack_3310;
  uint uStack_330c;
  undefined8 uStack_3308;
  undefined1 auStack_3300 [512];
  stat sStack_3100;
  char acStack_3070 [4096];
  char acStack_2070 [4096];
  ulong auStack_1070 [3];
  epoll_event aeStack_1054 [33];
  undefined8 uStack_e40;
  undefined8 uStack_e38;
  epoll_event aeStack_e30 [32];
  undefined1 auStack_c30 [8];
  ulong uStack_c28;
  ulong uStack_c20;
  code *pcStack_c00;
  ulong uStack_bf8;
  int iStack_bf0;
  undefined4 uStack_bec;
  undefined1 auStack_be8 [512];
  ulong uStack_9e8;
  undefined1 auStack_920 [512];
  code *pcStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  uint uStack_708;
  int iStack_704;
  undefined1 auStack_678 [512];
  ulong uStack_478;
  undefined1 auStack_440 [512];
  code *pcStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  int local_224;
  undefined1 local_218 [520];
  
  pcStack_240 = (code *)0x1071a3;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x30,
          "vfio_enable_msi");
  pcStack_240 = (code *)0x1071ac;
  iVar4 = eventfd(0,0);
  local_228 = 1;
  local_238 = 0x2400000018;
  uStack_230 = 1;
  pcStack_240 = (code *)0x1071d5;
  local_224 = iVar4;
  iVar5 = ioctl(device_fd,0x3b6e);
  if (iVar5 != -1) {
    return iVar4;
  }
  puVar16 = local_218;
  pcStack_240 = vfio_disable_msi;
  vfio_enable_msi_cold_1();
  pcStack_240 = (code *)(ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x4b,
          "vfio_disable_msi");
  uVar7 = 0x3b6e;
  iVar4 = ioctl((int)puVar16,0x3b6e);
  if (iVar4 != -1) {
    return 0;
  }
  puVar17 = auStack_440;
  vfio_disable_msi_cold_1();
  pcStack_720 = (code *)0x10729e;
  uStack_478 = (ulong)puVar16 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  pcStack_720 = (code *)0x1072a7;
  iVar4 = eventfd(0,0);
  uVar6 = 0x21;
  if (uVar7 < 0x21) {
    uVar6 = uVar7;
  }
  uStack_708 = 1;
  if (uVar7 != 0) {
    uStack_708 = uVar6;
  }
  uStack_718 = 0x2400000098;
  uStack_710 = 2;
  pcStack_720 = (code *)0x1072e4;
  iStack_704 = iVar4;
  iVar5 = ioctl((int)puVar17,0x3b6e);
  if (iVar5 != -1) {
    return iVar4;
  }
  puVar16 = auStack_678;
  pcStack_720 = vfio_disable_msix;
  vfio_enable_msix_cold_1();
  pcStack_720 = (code *)((ulong)puVar17 & 0xffffffff);
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar4 = ioctl((int)puVar16,0x3b6e);
  if (iVar4 != -1) {
    return 0;
  }
  puVar17 = auStack_920;
  vfio_disable_msix_cold_1();
  puVar20 = &uStack_bf8;
  pcStack_c00 = (code *)0x1073b6;
  uStack_9e8 = (ulong)puVar16 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar3 = (code *)0x2;
  while( true ) {
    pcVar9 = pcVar3;
    uStack_bf8 = 0x10;
    iVar5 = (int)pcVar9;
    uStack_bec = 0;
    uVar15 = 0x3b6d;
    pcStack_c00 = (code *)0x1073e3;
    iStack_bf0 = iVar5;
    iVar4 = ioctl((int)puVar17,0x3b6d,&uStack_bf8);
    uVar2 = uStack_bf8;
    if (iVar4 == -1) break;
    unaff_R12 = uStack_bf8 >> 0x20;
    if ((uStack_bf8 & 0x100000000) == 0) {
      pcStack_c00 = (code *)0x10740a;
      vfio_setup_interrupt_cold_1();
      pcVar9 = (code *)((ulong)unaff_R15 & 0xffffffff);
    }
    if ((uVar2 & 0x100000000) != 0) {
      return (int)pcVar9;
    }
    pcVar3 = (code *)(ulong)(iVar5 - 1);
    unaff_R15 = pcVar9;
    if (iVar5 == 0) {
      return -1;
    }
  }
  iVar4 = (int)auStack_be8;
  pcStack_c00 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_2();
  lVar1 = -((uVar15 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_e30 + lVar1);
  uStack_c28 = (ulong)puVar17 & 0xffffffff;
  uStack_c20 = unaff_R12;
  pcStack_c00 = pcVar9;
  *(undefined8 *)((long)&uStack_e38 + lVar1) = 0x107469;
  uVar7 = epoll_wait(iVar4,__events,(int)uVar15,__timeout);
  if (uVar7 != 0xffffffff) {
    puVar20 = (ulong *)(ulong)uVar7;
    if (0 < (int)uVar7) {
      lVar19 = 0;
      do {
        iVar4 = *(int *)((long)aeStack_e30 + lVar19 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_e38 + lVar1) = 0x107499;
        sVar10 = read(iVar4,auStack_c30,8);
        if (sVar10 == -1) {
          *(undefined8 *)((long)&uStack_e38 + lVar1) = 0x1074c6;
          vfio_epoll_wait_cold_1();
          goto LAB_001074c6;
        }
        lVar19 = lVar19 + 0xc;
      } while ((long)puVar20 * 0xc != lVar19);
    }
    return uVar7;
  }
LAB_001074c6:
  peVar18 = aeStack_e30;
  *(code **)((long)&uStack_e38 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_e38 + lVar1) = &pcStack_c00;
  *(epoll_event **)((long)&uStack_e40 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_1054 + lVar1) = 1;
  *(int *)((long)aeStack_1054 + lVar1 + 4) = (int)peVar18;
  *(undefined8 *)((long)auStack_1070 + lVar1 + 0x10) = 0x1074f0;
  uVar7 = epoll_create1(0);
  if (uVar7 == 0xffffffff) {
    *(undefined8 *)((long)auStack_1070 + lVar1 + 0x10) = 0x107525;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar7;
    *(undefined8 *)((long)auStack_1070 + lVar1 + 0x10) = 0x10750a;
    iVar4 = epoll_ctl(uVar7,1,(int)peVar18,(epoll_event *)((long)aeStack_1054 + lVar1));
    if (iVar4 != -1) {
      return uVar7;
    }
  }
  lVar19 = (long)aeStack_1054 + lVar1 + 0xc;
  *(code **)((long)auStack_1070 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_1070 + lVar1 + 0x10) = (ulong)peVar18 & 0xffffffff;
  *(ulong **)((long)auStack_1070 + lVar1 + 8) = puVar20;
  *(epoll_event **)((long)auStack_1070 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10755e;
  snprintf(acStack_2070 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar19);
  *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10756e;
  iVar4 = stat(acStack_2070 + lVar1,(stat *)((long)&sStack_3100 + lVar1));
  if (iVar4 < 0) {
    return -1;
  }
  pcVar12 = acStack_2070 + lVar1;
  *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107586;
  sVar11 = strlen(pcVar12);
  *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10759d;
  strncat(pcVar12,"iommu_group",0xfff - sVar11);
  __buf = acStack_3070 + lVar1;
  *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1075b2;
  sVar10 = readlink(pcVar12,__buf,0x1000);
  uVar14 = SUB84(__buf,0);
  if (sVar10 == -1) {
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107744;
    vfio_init_cold_11();
LAB_00107744:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10774e;
    vfio_init_cold_10();
LAB_0010774e:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107758;
    vfio_init_cold_8();
LAB_00107758:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107762;
    vfio_init_cold_7();
LAB_00107762:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10776c;
    vfio_init_cold_6();
LAB_0010776c:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107776;
    vfio_init_cold_5();
LAB_00107776:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107780;
    vfio_init_cold_3();
LAB_00107780:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10778a;
    vfio_init_cold_9();
LAB_0010778a:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107794;
    vfio_init_cold_1();
LAB_00107794:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10779e;
    vfio_init_cold_2();
  }
  else {
    acStack_3070[(int)sVar10 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1075d3;
    pcVar12 = __xpg_basename(acStack_3070 + lVar1);
    uVar14 = 0x108468;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1075e9;
    iVar4 = __isoc99_sscanf(pcVar12,"%d",(long)&uStack_330c + lVar1);
    if (iVar4 == -1) goto LAB_00107744;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1075f9;
    iVar4 = get_vfio_container();
    *(int *)((long)&iStack_3310 + lVar1) = iVar4;
    if (iVar4 == -1) {
      uVar14 = 2;
      *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107616;
      iVar5 = open("/dev/vfio/vfio",2);
      if (iVar5 == -1) goto LAB_00107780;
      *(int *)((long)&iStack_3310 + lVar1) = iVar5;
      *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107629;
      set_vfio_container(iVar5);
      uVar14 = 0x3b64;
      *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107638;
      iVar5 = ioctl(*(int *)((long)&iStack_3310 + lVar1),0x3b64);
      if (iVar5 != 0) goto LAB_0010778a;
      uVar14 = 0x3b65;
      *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107654;
      iVar5 = ioctl(*(int *)((long)&iStack_3310 + lVar1),0x3b65,1);
      if (iVar5 == 1) goto LAB_0010765d;
      goto LAB_00107794;
    }
LAB_0010765d:
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10767f;
    snprintf(acStack_2070 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_330c + lVar1)
            );
    uVar14 = 2;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x10768e;
    iVar5 = open(acStack_2070 + lVar1,2);
    if (iVar5 == -1) goto LAB_0010774e;
    *(undefined8 *)((long)&uStack_3308 + lVar1) = 8;
    uVar14 = 0x3b67;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1076b4;
    iVar8 = ioctl(iVar5,0x3b67);
    if (iVar8 == -1) goto LAB_00107758;
    if ((auStack_3300[lVar1 + -4] & 1) == 0) goto LAB_00107762;
    uVar14 = 0x3b68;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1076da;
    iVar8 = ioctl(iVar5,0x3b68,(long)&iStack_3310 + lVar1);
    if (iVar8 == -1) goto LAB_0010776c;
    if (iVar4 != -1) {
LAB_00107705:
      uVar14 = 0x3b6a;
      *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107717;
      iVar4 = ioctl(iVar5,0x3b6a,lVar19);
      if (iVar4 != -1) {
        *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x107725;
        vfio_enable_dma(iVar4);
        return iVar4;
      }
      goto LAB_00107776;
    }
    uVar14 = 0x3b66;
    *(undefined8 *)((long)&lStack_3318 + lVar1) = 0x1076fc;
    iVar4 = ioctl(*(int *)((long)&iStack_3310 + lVar1),0x3b66,1);
    if (iVar4 != -1) goto LAB_00107705;
  }
  iVar4 = (int)auStack_3300 + (int)lVar1;
  *(code **)((long)&lStack_3318 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_3318 + lVar1) = lVar19;
  *(undefined8 *)((long)auStack_3540 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_3530 + lVar1) = 0;
  *(undefined8 *)((long)asStack_3530 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_3530 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_3530 + lVar1) = uVar14;
  *(undefined8 *)((long)auStack_3540 + lVar1) = 0x1077d3;
  iVar5 = ioctl(iVar4,0x3b6c);
  if (iVar5 != -1) {
    sVar11 = *(size_t *)((long)asStack_3530 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_3530 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_3540 + lVar1) = 0x1077f6;
    pvVar13 = mmap((void *)0x0,sVar11,3,1,iVar4,__offset);
    if (pvVar13 != (void *)0xffffffffffffffff) goto LAB_0010780d;
    *(undefined8 *)((long)auStack_3540 + lVar1) = 0x107806;
    vfio_map_region_cold_1();
  }
  pvVar13 = (void *)0xffffffffffffffff;
LAB_0010780d:
  return (int)pvVar13;
}

Assistant:

int vfio_enable_msi(int device_fd) {
	info("Enable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 1;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	*fd_ptr = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSI interrupts");

	return event_fd;
}